

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

ssize_t __thiscall
QNativeSocketEngine::write(QNativeSocketEngine *this,int __fd,void *__buf,size_t __n)

{
  QNativeSocketEnginePrivate *this_00;
  ulong uVar1;
  undefined4 in_register_00000034;
  QNativeSocketEnginePrivate *this_01;
  long in_FS_OFFSET;
  QNativeSocketEnginePrivate *d;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  int line;
  qint64 local_50;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  this_01 = (QNativeSocketEnginePrivate *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QNativeSocketEngine *)0x26036a);
  uVar1 = (**(code **)(*(long *)this + 0x78))();
  if ((uVar1 & 1) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)this,line,in_stack_ffffffffffffff78);
    QMessageLogger::warning
              (local_28,"QNativeSocketEngine::write() was called on an uninitialized socket device")
    ;
    local_50 = -1;
  }
  else if ((this_00->super_QAbstractSocketEnginePrivate).socketState == ConnectedState) {
    local_50 = QNativeSocketEnginePrivate::nativeWrite(this_01,(char *)__buf,(qint64)this_00);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)this,line,in_stack_ffffffffffffff78);
    QMessageLogger::warning
              (local_48,
               "QNativeSocketEngine::write() was not called in QAbstractSocket::ConnectedState");
    local_50 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QNativeSocketEngine::write(const char *data, qint64 size)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::write(), -1);
    Q_CHECK_STATE(QNativeSocketEngine::write(), QAbstractSocket::ConnectedState, -1);
    return d->nativeWrite(data, size);
}